

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_convolve_y_sr_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  ushort uVar1;
  int16_t *piVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ushort *puVar6;
  int iVar7;
  ulong uVar8;
  ushort *puVar9;
  ulong local_58;
  ushort *local_50;
  
  if (0 < h) {
    uVar1 = filter_params_y->taps;
    piVar2 = filter_params_y->filter_ptr;
    lVar5 = (long)src_stride;
    local_50 = src + (1 - (ulong)(uVar1 >> 1)) * lVar5;
    local_58 = 0;
    do {
      if (0 < w) {
        uVar8 = 0;
        puVar9 = local_50;
        do {
          if ((ulong)filter_params_y->taps == 0) {
            iVar7 = 0;
          }
          else {
            uVar4 = 0;
            iVar7 = 0;
            puVar6 = puVar9;
            do {
              iVar7 = iVar7 + (uint)*puVar6 *
                              (int)*(short *)((long)piVar2 +
                                             uVar4 * 2 +
                                             (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2));
              uVar4 = uVar4 + 1;
              puVar6 = puVar6 + lVar5;
            } while (filter_params_y->taps != uVar4);
            iVar7 = iVar7 + 0x40 >> 7;
          }
          if (bd == 10) {
            iVar3 = 0x3ff;
          }
          else if (bd == 0xc) {
            iVar3 = 0xfff;
          }
          else {
            iVar3 = 0xff;
          }
          if (iVar3 <= iVar7) {
            iVar7 = iVar3;
          }
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          dst[local_58 * (long)dst_stride + uVar8] = (uint16_t)iVar7;
          uVar8 = uVar8 + 1;
          puVar9 = puVar9 + 1;
        } while (uVar8 != (uint)w);
      }
      local_58 = local_58 + 1;
      local_50 = local_50 + lVar5;
    } while (local_58 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_c(const uint16_t *src, int src_stride,
                                uint16_t *dst, int dst_stride, int w, int h,
                                const InterpFilterParams *filter_params_y,
                                const int subpel_y_qn, int bd) {
  const int fo_vert = filter_params_y->taps / 2 - 1;
  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      dst[y * dst_stride + x] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(res, FILTER_BITS), bd);
    }
  }
}